

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageFormat(Image *image,int newFormat)

{
  ushort uVar1;
  unsigned_short uVar2;
  int iVar3;
  void *__ptr;
  void *pvVar4;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pvVar4 = image->data;
  if ((((pvVar4 != (void *)0x0) && (image->width != 0)) && (newFormat != 0 && image->height != 0))
     && (iVar3 = image->format, iVar3 != newFormat)) {
    if (0xd < newFormat || 0xd < iVar3) {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
      return;
    }
    uVar6 = image->height * image->width;
    __ptr = malloc((long)(int)uVar6 << 4);
    if (0 < (int)uVar6) {
      pfVar8 = (float *)((long)__ptr + 0xc);
      uVar7 = 0;
      iVar9 = 0;
      do {
        switch(iVar3) {
        case 1:
          pfVar8[-3] = (float)*(byte *)((long)pvVar4 + uVar7) / 255.0;
          pfVar8[-2] = (float)*(byte *)((long)pvVar4 + uVar7) / 255.0;
          pfVar8[-1] = (float)*(byte *)((long)pvVar4 + uVar7) / 255.0;
          goto LAB_00195892;
        case 2:
          lVar10 = (long)iVar9;
          pfVar8[-3] = (float)*(byte *)((long)pvVar4 + lVar10) / 255.0;
          pfVar8[-2] = (float)*(byte *)((long)pvVar4 + lVar10) / 255.0;
          pfVar8[-1] = (float)*(byte *)((long)pvVar4 + lVar10) / 255.0;
          *pfVar8 = (float)*(byte *)((long)pvVar4 + lVar10 + 1) / 255.0;
          iVar9 = iVar9 + 2;
          break;
        case 3:
          uVar1 = *(ushort *)((long)pvVar4 + uVar7 * 2);
          pfVar8[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar8[-2] = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
          pfVar8[-1] = (float)(uVar1 & 0x1f) * 0.032258064;
          goto LAB_00195892;
        case 4:
          lVar10 = (long)iVar9;
          pfVar8[-3] = (float)*(byte *)((long)pvVar4 + lVar10) / 255.0;
          pfVar8[-2] = (float)*(byte *)((long)pvVar4 + lVar10 + 1) / 255.0;
          fVar11 = (float)*(byte *)((long)pvVar4 + lVar10 + 2) / 255.0;
          goto LAB_001958be;
        case 5:
          uVar1 = *(ushort *)((long)pvVar4 + uVar7 * 2);
          pfVar8[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar8[-2] = (float)(uVar1 >> 6 & 0x1f) * 0.032258064;
          pfVar8[-1] = (float)(uVar1 >> 1 & 0x1f) * 0.032258064;
          fVar11 = 0.0;
          if ((uVar1 & 1) != 0) {
            fVar11 = 1.0;
          }
          *pfVar8 = fVar11;
          break;
        case 6:
          uVar1 = *(ushort *)((long)pvVar4 + uVar7 * 2);
          pfVar8[-3] = (float)(uVar1 >> 0xc) * 0.06666667;
          pfVar8[-2] = (float)(uVar1 >> 8 & 0xf) * 0.06666667;
          pfVar8[-1] = (float)(uVar1 >> 4 & 0xf) * 0.06666667;
          *pfVar8 = (float)(uVar1 & 0xf) * 0.06666667;
          break;
        case 7:
          lVar10 = (long)iVar9;
          pfVar8[-3] = (float)*(byte *)((long)pvVar4 + lVar10) / 255.0;
          pfVar8[-2] = (float)*(byte *)((long)pvVar4 + lVar10 + 1) / 255.0;
          pfVar8[-1] = (float)*(byte *)((long)pvVar4 + lVar10 + 2) / 255.0;
          fVar11 = (float)*(byte *)((long)pvVar4 + lVar10 + 3) / 255.0;
          goto LAB_00195860;
        case 8:
          fVar11 = *(float *)((long)pvVar4 + (long)iVar9 * 4);
          goto LAB_00195884;
        case 9:
          lVar10 = (long)iVar9;
          pfVar8[-3] = *(float *)((long)pvVar4 + lVar10 * 4);
          pfVar8[-2] = *(float *)((long)pvVar4 + lVar10 * 4 + 4);
          fVar11 = *(float *)((long)pvVar4 + lVar10 * 4 + 8);
          goto LAB_001958be;
        case 10:
          lVar10 = (long)iVar9;
          pfVar8[-3] = *(float *)((long)pvVar4 + lVar10 * 4);
          pfVar8[-2] = *(float *)((long)pvVar4 + lVar10 * 4 + 4);
          pfVar8[-1] = *(float *)((long)pvVar4 + lVar10 * 4 + 8);
          fVar11 = *(float *)((long)pvVar4 + lVar10 * 4 + 0xc);
          goto LAB_00195860;
        case 0xb:
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + (long)iVar9 * 2));
LAB_00195884:
          pfVar8[-3] = fVar11;
          pfVar8[-2] = 0.0;
          pfVar8[-1] = 0.0;
LAB_00195892:
          *pfVar8 = 1.0;
          break;
        case 0xc:
          lVar10 = (long)iVar9;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2));
          pfVar8[-3] = fVar11;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2 + 2));
          pfVar8[-2] = fVar11;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2 + 4));
LAB_001958be:
          pfVar8[-1] = fVar11;
          *pfVar8 = 1.0;
          iVar9 = iVar9 + 3;
          break;
        case 0xd:
          lVar10 = (long)iVar9;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2));
          pfVar8[-3] = fVar11;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2 + 2));
          pfVar8[-2] = fVar11;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2 + 4));
          pfVar8[-1] = fVar11;
          fVar11 = HalfToFloat(*(unsigned_short *)((long)pvVar4 + lVar10 * 2 + 6));
LAB_00195860:
          *pfVar8 = fVar11;
          iVar9 = iVar9 + 4;
        }
        uVar7 = uVar7 + 1;
        pfVar8 = pfVar8 + 4;
      } while (uVar6 != uVar7);
    }
    free(image->data);
    image->data = (void *)0x0;
    image->format = newFormat;
    switch(newFormat) {
    case 1:
      iVar3 = image->height * image->width;
      pvVar4 = malloc((long)iVar3);
      image->data = pvVar4;
      if (0 < iVar3) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          *(char *)((long)image->data + lVar10) =
               (char)(int)((*pfVar8 * 0.114 + pfVar8[-1] * 0.587 + pfVar8[-2] * 0.299) * 255.0);
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 2:
      pvVar4 = malloc((long)(image->width * image->height * 2));
      image->data = pvVar4;
      if (0 < image->width * image->height * 2) {
        lVar10 = 0;
        do {
          *(char *)((long)image->data + lVar10) =
               (char)(int)((*(float *)((long)__ptr + lVar10 * 8 + 8) * 0.114 +
                           *(float *)((long)__ptr + lVar10 * 8 + 4) * 0.587 +
                           *(float *)((long)__ptr + lVar10 * 8) * 0.299) * 255.0);
          *(char *)((long)image->data + lVar10 + 1) =
               (char)(int)(*(float *)((long)__ptr + lVar10 * 8 + 0xc) * 255.0);
          lVar10 = lVar10 + 2;
        } while (lVar10 < image->width * image->height * 2);
      }
      break;
    case 3:
      pvVar4 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar4;
      if (0 < image->height * image->width) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          fVar11 = roundf(pfVar8[-2] * 31.0);
          fVar12 = roundf(pfVar8[-1] * 63.0);
          fVar13 = roundf(*pfVar8 * 31.0);
          *(ushort *)((long)image->data + lVar10 * 2) =
               (ushort)(int)fVar13 & 0xff | (ushort)((int)fVar11 << 0xb) |
               (ushort)(((int)fVar12 & 0xffU) << 5);
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 4:
      pvVar4 = malloc((long)(image->width * image->height * 3));
      image->data = pvVar4;
      if (0 < image->width * image->height * 3) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          *(char *)((long)image->data + lVar10) = (char)(int)(pfVar8[-2] * 255.0);
          *(char *)((long)image->data + lVar10 + 1) = (char)(int)(pfVar8[-1] * 255.0);
          *(char *)((long)image->data + lVar10 + 2) = (char)(int)(*pfVar8 * 255.0);
          lVar10 = lVar10 + 3;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < image->width * image->height * 3);
      }
      break;
    case 5:
      pvVar4 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar4;
      if (0 < image->height * image->width) {
        pfVar8 = (float *)((long)__ptr + 0xc);
        lVar10 = 0;
        do {
          fVar11 = roundf(pfVar8[-3] * 31.0);
          fVar12 = roundf(pfVar8[-2] * 31.0);
          fVar13 = roundf(pfVar8[-1] * 31.0);
          *(ushort *)((long)image->data + lVar10 * 2) =
               (ushort)(0.19607843 < *pfVar8) | (ushort)((int)fVar11 << 0xb) |
               (ushort)(((int)fVar12 & 0xffU) << 6) | ((ushort)(int)fVar13 & 0xff) * 2;
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 6:
      pvVar4 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar4;
      if (0 < image->height * image->width) {
        pfVar8 = (float *)((long)__ptr + 0xc);
        lVar10 = 0;
        do {
          fVar11 = roundf(pfVar8[-3] * 15.0);
          fVar12 = roundf(pfVar8[-2] * 15.0);
          fVar13 = roundf(pfVar8[-1] * 15.0);
          fVar14 = roundf(*pfVar8 * 15.0);
          *(ushort *)((long)image->data + lVar10 * 2) =
               (ushort)(int)fVar14 & 0xff |
               (ushort)(((int)fVar13 & 0xffU) << 4) |
               (ushort)((int)fVar12 << 8) | (ushort)((int)fVar11 << 0xc);
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 7:
      pvVar4 = malloc((long)(image->width * image->height * 4));
      image->data = pvVar4;
      if (0 < image->width * image->height * 4) {
        lVar10 = 0;
        do {
          *(char *)((long)image->data + lVar10) =
               (char)(int)(*(float *)((long)__ptr + lVar10 * 4) * 255.0);
          *(char *)((long)image->data + lVar10 + 1) =
               (char)(int)(*(float *)((long)__ptr + lVar10 * 4 + 4) * 255.0);
          *(char *)((long)image->data + lVar10 + 2) =
               (char)(int)(*(float *)((long)__ptr + lVar10 * 4 + 8) * 255.0);
          *(char *)((long)image->data + lVar10 + 3) =
               (char)(int)(*(float *)((long)__ptr + lVar10 * 4 + 0xc) * 255.0);
          lVar10 = lVar10 + 4;
        } while (lVar10 < image->width * image->height * 4);
      }
      break;
    case 8:
      pvVar4 = malloc((long)image->height * (long)image->width * 4);
      image->data = pvVar4;
      if (0 < image->height * image->width) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          *(float *)((long)image->data + lVar10 * 4) =
               *pfVar8 * 0.114 + pfVar8[-1] * 0.587 + pfVar8[-2] * 0.299;
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 9:
      pvVar4 = malloc((long)(image->width * image->height * 3) << 2);
      image->data = pvVar4;
      if (0 < image->width * image->height * 3) {
        puVar5 = (undefined4 *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          *(undefined4 *)((long)image->data + lVar10 * 4) = puVar5[-2];
          *(undefined4 *)((long)image->data + lVar10 * 4 + 4) = puVar5[-1];
          *(undefined4 *)((long)image->data + lVar10 * 4 + 8) = *puVar5;
          lVar10 = lVar10 + 3;
          puVar5 = puVar5 + 4;
        } while (lVar10 < image->width * image->height * 3);
      }
      break;
    case 10:
      pvVar4 = malloc((long)(image->width * image->height * 4) << 2);
      image->data = pvVar4;
      if (0 < image->width * image->height * 4) {
        lVar10 = 0;
        do {
          *(undefined4 *)((long)image->data + lVar10 * 4) =
               *(undefined4 *)((long)__ptr + lVar10 * 4);
          *(undefined4 *)((long)image->data + lVar10 * 4 + 4) =
               *(undefined4 *)((long)__ptr + lVar10 * 4 + 4);
          *(undefined4 *)((long)image->data + lVar10 * 4 + 8) =
               *(undefined4 *)((long)__ptr + lVar10 * 4 + 8);
          *(undefined4 *)((long)image->data + lVar10 * 4 + 0xc) =
               *(undefined4 *)((long)__ptr + lVar10 * 4 + 0xc);
          lVar10 = lVar10 + 4;
        } while (lVar10 < image->width * image->height * 4);
      }
      break;
    case 0xb:
      pvVar4 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar4;
      if (0 < image->height * image->width) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          uVar2 = FloatToHalf(*pfVar8 * 0.114 + pfVar8[-1] * 0.587 + pfVar8[-2] * 0.299);
          *(unsigned_short *)((long)image->data + lVar10 * 2) = uVar2;
          lVar10 = lVar10 + 1;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < (long)image->height * (long)image->width);
      }
      break;
    case 0xc:
      pvVar4 = malloc((long)(image->width * image->height * 3) * 2);
      image->data = pvVar4;
      if (0 < image->width * image->height * 3) {
        pfVar8 = (float *)((long)__ptr + 8);
        lVar10 = 0;
        do {
          uVar2 = FloatToHalf(pfVar8[-2]);
          *(unsigned_short *)((long)image->data + lVar10 * 2) = uVar2;
          uVar2 = FloatToHalf(pfVar8[-1]);
          *(unsigned_short *)((long)image->data + lVar10 * 2 + 2) = uVar2;
          uVar2 = FloatToHalf(*pfVar8);
          *(unsigned_short *)((long)image->data + lVar10 * 2 + 4) = uVar2;
          lVar10 = lVar10 + 3;
          pfVar8 = pfVar8 + 4;
        } while (lVar10 < image->width * image->height * 3);
      }
      break;
    case 0xd:
      pvVar4 = malloc((long)(image->width * image->height * 4) * 2);
      image->data = pvVar4;
      if (0 < image->width * image->height * 4) {
        lVar10 = 0;
        do {
          uVar2 = FloatToHalf(*(float *)((long)__ptr + lVar10 * 4));
          *(unsigned_short *)((long)image->data + lVar10 * 2) = uVar2;
          uVar2 = FloatToHalf(*(float *)((long)__ptr + lVar10 * 4 + 4));
          *(unsigned_short *)((long)image->data + lVar10 * 2 + 2) = uVar2;
          uVar2 = FloatToHalf(*(float *)((long)__ptr + lVar10 * 4 + 8));
          *(unsigned_short *)((long)image->data + lVar10 * 2 + 4) = uVar2;
          uVar2 = FloatToHalf(*(float *)((long)__ptr + lVar10 * 4 + 0xc));
          *(unsigned_short *)((long)image->data + lVar10 * 2 + 6) = uVar2;
          lVar10 = lVar10 + 4;
        } while (lVar10 < image->width * image->height * 4);
      }
    }
    free(__ptr);
    if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
      ImageMipmaps(image);
      return;
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE equivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16:
                {
                    // WARNING: Image is converted to GRAYSCALE equivalent 16bit

                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf((float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f));
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned short));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf(pixels[k].x);
                        ((unsigned short *)image->data)[i + 1] = FloatToHalf(pixels[k].y);
                        ((unsigned short *)image->data)[i + 2] = FloatToHalf(pixels[k].z);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned short));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf(pixels[k].x);
                        ((unsigned short *)image->data)[i + 1] = FloatToHalf(pixels[k].y);
                        ((unsigned short *)image->data)[i + 2] = FloatToHalf(pixels[k].z);
                        ((unsigned short *)image->data)[i + 3] = FloatToHalf(pixels[k].w);
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formatted image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}